

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strval(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int local_2c;
  char *pcStack_28;
  int iLen;
  char *zVal;
  jx9_value **apArg_local;
  jx9_context *pjStack_10;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zVal = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_10 = pCtx;
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    local_2c = 0;
    pcStack_28 = jx9_value_to_string(*apArg,&local_2c);
    jx9_result_string(pjStack_10,pcStack_28,local_2c);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strval(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* return NULL */
		jx9_result_null(pCtx);
	}else{
		const char *zVal;
		int iLen = 0; /* cc -O6 warning */
		/* Perform the cast */
		zVal = jx9_value_to_string(apArg[0], &iLen);
		jx9_result_string(pCtx, zVal, iLen);
	}
	return JX9_OK;
}